

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
poly::
vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
::obtain_storage(vector<Interface,_std::allocator<Interface>,_poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>_>
                 *this,my_base *a,long n,size_t max_align)

{
  elem_ptr_const_pointer begin;
  void_pointer pvVar1;
  undefined1 auVar2 [16];
  poly_copy_descr ret;
  poly_copy_descr local_38;
  
  this->_align_max = max_align;
  begin = (elem_ptr_const_pointer)
          (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  poly_uninitialized_move(&local_38,a,a->_storage,begin,this->_free_elem,begin + n,max_align);
  tidy(this);
  pvVar1 = (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage = a->_storage;
  a->_storage = pvVar1;
  pvVar1 = (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage;
  (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage = a->_end_storage;
  a->_end_storage = pvVar1;
  auVar2._0_8_ = local_38.
                 super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                 .
                 super__Head_base<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                 ._M_head_impl;
  auVar2._8_4_ = (int)local_38.
                      super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                      .
                      super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
                      .
                      super__Head_base<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
                      ._M_head_impl;
  auVar2._12_4_ =
       local_38.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<1UL,_poly::vector_elem_ptr<poly::delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl._4_4_;
  this->_free_elem = (elem_ptr_pointer)auVar2._0_8_;
  this->_begin_storage = (void_pointer)auVar2._8_8_;
  this->_align_max = max_align;
  return;
}

Assistant:

inline void vector<I, A, C>::obtain_storage(
    my_base&& a, size_t n, size_t max_align, std::false_type /*unused*/) noexcept
{
    _align_max = max_align;
    auto ret   = poly_uninitialized_move(
        a, a.storage(), begin_elem(), end_elem(), std::next(begin_elem(), n), max_align);
    tidy();
    base().swap(a);
    set_ptrs(ret);
    _align_max = max_align;
}